

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O2

PHYSFS_File * doOpenWrite(char *_fname,int appending)

{
  void *pvVar1;
  _func_PHYSFS_Io_ptr_void_ptr_char_ptr *p_Var2;
  _func_void_PHYSFS_Io_ptr *p_Var3;
  PHYSFS_uint64 PVar4;
  undefined8 uVar5;
  DirHandle *pDVar6;
  int iVar7;
  size_t sVar8;
  char *dst;
  PHYSFS_Io *pPVar9;
  FileHandle *pFVar10;
  undefined1 *puVar11;
  undefined8 *puVar12;
  undefined1 *ptr;
  undefined8 uStack_40;
  undefined1 auStack_38 [8];
  char *local_30;
  char *fname;
  
  puVar11 = auStack_38;
  if (_fname == (char *)0x0) {
    puVar12 = &uStack_40;
    uStack_40 = 9;
LAB_00108ee0:
    uVar5 = *puVar12;
    *puVar12 = 0x108ee6;
    PHYSFS_setErrorCode((PHYSFS_ErrorCode)uVar5);
    return (PHYSFS_File *)0x0;
  }
  uStack_40 = 0x108e02;
  sVar8 = strlen(_fname);
  if (sVar8 + 1 < 0x100) {
    puVar11 = auStack_38 + -(sVar8 + 0x18 & 0xfffffffffffffff0);
    ptr = puVar11;
  }
  else {
    ptr = (undefined1 *)0x0;
  }
  *(undefined8 *)(puVar11 + -8) = 0x108e30;
  dst = (char *)__PHYSFS_initSmallAlloc(ptr,sVar8 + 1);
  local_30 = dst;
  if (dst == (char *)0x0) {
    puVar12 = (undefined8 *)(puVar11 + -8);
    *(undefined8 *)(puVar11 + -8) = 2;
    goto LAB_00108ee0;
  }
  *(undefined8 *)(puVar11 + -8) = 0x108e4b;
  iVar7 = sanitizePlatformIndependentPath(_fname,dst);
  if (iVar7 == 0) {
    pFVar10 = (FileHandle *)0x0;
    goto LAB_00108f0d;
  }
  *(undefined8 *)(puVar11 + -8) = 0x108e5f;
  __PHYSFS_platformGrabMutex(stateLock);
  pDVar6 = writeDir;
  if (writeDir == (DirHandle *)0x0) {
    *(undefined8 *)(puVar11 + -8) = 0xd;
LAB_00108ef2:
    uVar5 = *(undefined8 *)(puVar11 + -8);
    *(undefined8 *)(puVar11 + -8) = 0x108ef8;
    PHYSFS_setErrorCode((PHYSFS_ErrorCode)uVar5);
LAB_00108efe:
    pFVar10 = (FileHandle *)0x0;
  }
  else {
    *(undefined8 *)(puVar11 + -8) = 0x108e7d;
    iVar7 = verifyPath(writeDir,&local_30,0);
    dst = local_30;
    if (iVar7 == 0) goto LAB_00108efe;
    pvVar1 = pDVar6->opaque;
    p_Var2 = (&pDVar6->funcs->openWrite)[appending != 0];
    *(undefined8 *)(puVar11 + -8) = 0x108e9b;
    pPVar9 = (*p_Var2)(pvVar1,dst);
    if (pPVar9 == (PHYSFS_Io *)0x0) goto LAB_00108efe;
    *(undefined8 *)(puVar11 + -8) = 0x40;
    PVar4 = *(PHYSFS_uint64 *)(puVar11 + -8);
    *(undefined8 *)(puVar11 + -8) = 0x108eac;
    pFVar10 = (FileHandle *)(*__PHYSFS_AllocatorHooks.Malloc)(PVar4);
    if (pFVar10 == (FileHandle *)0x0) {
      p_Var3 = pPVar9->destroy;
      *(undefined8 *)(puVar11 + -8) = 0x108f2d;
      (*p_Var3)(pPVar9);
      *(undefined8 *)(puVar11 + -8) = 2;
      goto LAB_00108ef2;
    }
    *(undefined8 *)&pFVar10->forReading = 0;
    pFVar10->dirHandle = (DirHandle *)0x0;
    pFVar10->buffill = 0;
    pFVar10->bufpos = 0;
    pFVar10->buffer = (PHYSFS_uint8 *)0x0;
    pFVar10->bufsize = 0;
    pFVar10->io = pPVar9;
    pFVar10->dirHandle = pDVar6;
    pFVar10->next = openWriteList;
    openWriteList = pFVar10;
  }
  *(undefined8 *)(puVar11 + -8) = 0x108f0d;
  __PHYSFS_platformReleaseMutex(stateLock);
LAB_00108f0d:
  *(undefined8 *)(puVar11 + -8) = 0x108f15;
  __PHYSFS_smallFree(dst);
  return (PHYSFS_File *)pFVar10;
}

Assistant:

static PHYSFS_File *doOpenWrite(const char *_fname, int appending)
{
    FileHandle *fh = NULL;
    size_t len;
    char *fname;

    BAIL_IF(!_fname, PHYSFS_ERR_INVALID_ARGUMENT, 0);
    len = strlen(_fname) + 1;
    fname = (char *) __PHYSFS_smallAlloc(len);
    BAIL_IF(!fname, PHYSFS_ERR_OUT_OF_MEMORY, 0);

    if (sanitizePlatformIndependentPath(_fname, fname))
    {
        PHYSFS_Io *io = NULL;
        DirHandle *h = NULL;
        const PHYSFS_Archiver *f;

        __PHYSFS_platformGrabMutex(stateLock);

        GOTO_IF(!writeDir, PHYSFS_ERR_NO_WRITE_DIR, doOpenWriteEnd);

        h = writeDir;
        GOTO_IF_ERRPASS(!verifyPath(h, &fname, 0), doOpenWriteEnd);

        f = h->funcs;
        if (appending)
            io = f->openAppend(h->opaque, fname);
        else
            io = f->openWrite(h->opaque, fname);

        GOTO_IF_ERRPASS(!io, doOpenWriteEnd);

        fh = (FileHandle *) allocator.Malloc(sizeof (FileHandle));
        if (fh == NULL)
        {
            io->destroy(io);
            GOTO(PHYSFS_ERR_OUT_OF_MEMORY, doOpenWriteEnd);
        } /* if */
        else
        {
            memset(fh, '\0', sizeof (FileHandle));
            fh->io = io;
            fh->dirHandle = h;
            fh->next = openWriteList;
            openWriteList = fh;
        } /* else */

        doOpenWriteEnd:
        __PHYSFS_platformReleaseMutex(stateLock);
    } /* if */

    __PHYSFS_smallFree(fname);
    return ((PHYSFS_File *) fh);
}